

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocumentlayout.cpp
# Opt level: O3

void __thiscall
QTextDocumentLayoutPrivate::floatMargins
          (QTextDocumentLayoutPrivate *this,QFixed y,QTextLayoutStruct *layoutStruct,QFixed *left,
          QFixed *right)

{
  int iVar1;
  int iVar2;
  QTextFrameLayoutData *data;
  long lVar3;
  QTextFrameLayoutData *data_00;
  long lVar4;
  QFixed *pQVar5;
  _func_int **pp_Var6;
  QTextFrame *pQVar7;
  long in_FS_OFFSET;
  QTextFormat local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  left->val = (layoutStruct->x_left).val;
  right->val = (layoutStruct->x_right).val;
  pQVar7 = layoutStruct->frame;
  data = QTextFrame::layoutData(pQVar7);
  if (data == (QTextFrameLayoutData *)0x0) {
    lVar3 = QMetaObject::cast((QObject *)&QTextTable::staticMetaObject);
    if (lVar3 == 0) {
      data = (QTextFrameLayoutData *)operator_new(0x78);
      data->_vptr_QTextFrameLayoutData = (_func_int **)&PTR__QTextFrameData_007dcf10;
      data[1]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      data[2]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      data[3]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      data[4]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      data[5]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      data[6]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      data[7]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      data[8]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      *(undefined4 *)&data[9]._vptr_QTextFrameLayoutData = 0x1fffffc0;
      data[10]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      *(undefined2 *)&data[0xb]._vptr_QTextFrameLayoutData = 0x101;
      data[0xc]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      data[0xd]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      data[0xe]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
    }
    else {
      data = (QTextFrameLayoutData *)operator_new(0x160);
      data[1]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      data[2]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      data[3]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      data[4]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      data[5]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      data[6]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      data[7]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      data[8]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      *(undefined4 *)&data[9]._vptr_QTextFrameLayoutData = 0x1fffffc0;
      data[10]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      *(undefined2 *)&data[0xb]._vptr_QTextFrameLayoutData = 0x101;
      data[0xc]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      data[0xd]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      data[0xe]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      data[0xf]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      data->_vptr_QTextFrameLayoutData = (_func_int **)&PTR__QTextTableData_007dd0c0;
      data[0x2a]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      data[0x2b]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      memset(data + 0x11,0,0xc0);
    }
    QTextFrame::setLayoutData(pQVar7,data);
  }
  if (data[0xe]._vptr_QTextFrameLayoutData != (_func_int **)0x0) {
    lVar3 = 8;
    pp_Var6 = (_func_int **)0x0;
    do {
      lVar4 = *(long *)((long)data[0xd]._vptr_QTextFrameLayoutData + lVar3 + -8);
      if ((lVar4 == 0) || (*(int *)(lVar4 + 4) == 0)) {
        pQVar7 = (QTextFrame *)0x0;
      }
      else {
        pQVar7 = *(QTextFrame **)((long)data[0xd]._vptr_QTextFrameLayoutData + lVar3);
      }
      data_00 = QTextFrame::layoutData(pQVar7);
      if (data_00 == (QTextFrameLayoutData *)0x0) {
        lVar4 = QMetaObject::cast((QObject *)&QTextTable::staticMetaObject);
        if (lVar4 == 0) {
          data_00 = (QTextFrameLayoutData *)operator_new(0x78);
          data_00->_vptr_QTextFrameLayoutData = (_func_int **)&PTR__QTextFrameData_007dcf10;
          data_00[1]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          data_00[2]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          data_00[3]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          data_00[4]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          data_00[5]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          data_00[6]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          data_00[7]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          data_00[8]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          *(undefined4 *)&data_00[9]._vptr_QTextFrameLayoutData = 0x1fffffc0;
          data_00[10]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          *(undefined2 *)&data_00[0xb]._vptr_QTextFrameLayoutData = 0x101;
          data_00[0xc]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          data_00[0xd]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          data_00[0xe]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
        }
        else {
          data_00 = (QTextFrameLayoutData *)operator_new(0x160);
          data_00[1]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          data_00[2]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          data_00[3]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          data_00[4]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          data_00[5]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          data_00[6]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          data_00[7]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          data_00[8]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          *(undefined4 *)&data_00[9]._vptr_QTextFrameLayoutData = 0x1fffffc0;
          data_00[10]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          *(undefined2 *)&data_00[0xb]._vptr_QTextFrameLayoutData = 0x101;
          data_00[0xc]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          data_00[0xd]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          data_00[0xe]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          data_00[0xf]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          data_00->_vptr_QTextFrameLayoutData = (_func_int **)&PTR__QTextTableData_007dd0c0;
          data_00[0x2a]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          data_00[0x2b]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          memset(data_00 + 0x11,0,0xc0);
        }
        QTextFrame::setLayoutData(pQVar7,data_00);
      }
      if (((*(char *)((long)&data_00[0xb]._vptr_QTextFrameLayoutData + 1) == '\0') &&
          (iVar2 = *(int *)((long)&data_00[1]._vptr_QTextFrameLayoutData + 4), iVar2 <= y.val)) &&
         (y.val < iVar2 + *(int *)((long)&data_00[2]._vptr_QTextFrameLayoutData + 4))) {
        QTextFrame::frameFormat((QTextFrame *)&local_48);
        iVar1 = QTextFormat::intProperty(&local_48,0x800);
        QTextFormat::~QTextFormat(&local_48);
        iVar2 = *(int *)&data_00[1]._vptr_QTextFrameLayoutData;
        if (iVar1 == 1) {
          iVar2 = iVar2 + *(int *)&data_00[2]._vptr_QTextFrameLayoutData;
          pQVar5 = left;
          if (iVar2 < left->val) {
            iVar2 = left->val;
          }
        }
        else {
          pQVar5 = right;
          if (right->val < iVar2) {
            iVar2 = right->val;
          }
        }
        pQVar5->val = iVar2;
      }
      pp_Var6 = (_func_int **)((long)pp_Var6 + 1);
      lVar3 = lVar3 + 0x10;
    } while (pp_Var6 < data[0xe]._vptr_QTextFrameLayoutData);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTextDocumentLayoutPrivate::floatMargins(QFixed y, const QTextLayoutStruct *layoutStruct,
                                              QFixed *left, QFixed *right) const
{
//     qDebug() << "floatMargins y=" << y;
    *left = layoutStruct->x_left;
    *right = layoutStruct->x_right;
    QTextFrameData *lfd = data(layoutStruct->frame);
    for (int i = 0; i < lfd->floats.size(); ++i) {
        QTextFrameData *fd = data(lfd->floats.at(i));
        if (!fd->layoutDirty) {
            if (fd->position.y <= y && fd->position.y + fd->size.height > y) {
//                 qDebug() << "adjusting with float" << f << fd->position.x()<< fd->size.width();
                if (lfd->floats.at(i)->frameFormat().position() == QTextFrameFormat::FloatLeft)
                    *left = qMax(*left, fd->position.x + fd->size.width);
                else
                    *right = qMin(*right, fd->position.x);
            }
        }
    }
//     qDebug() << "floatMargins: left="<<*left<<"right="<<*right<<"y="<<y;
}